

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

int search_numerative_class(char **list,NJDNode *node)

{
  int iVar1;
  char *__s1;
  NJDNode *in_RSI;
  long in_RDI;
  char *str;
  int i;
  int local_1c;
  
  __s1 = NJDNode_get_string(in_RSI);
  iVar1 = strcmp(__s1,"*");
  if (iVar1 != 0) {
    local_1c = 0;
    while (*(long *)(in_RDI + (long)local_1c * 8) != 0) {
      iVar1 = strcmp(*(char **)(in_RDI + (long)local_1c * 8),__s1);
      if (iVar1 == 0) {
        return 1;
      }
      local_1c = local_1c + 1;
    }
  }
  return 0;
}

Assistant:

static int search_numerative_class(const char *list[], NJDNode * node)
{
   int i;
   const char *str = NJDNode_get_string(node);

   if (strcmp(str, "*") == 0)
      return 0;
   for (i = 0; list[i] != NULL; i++) {
      if (strcmp(list[i], str) == 0)
         return 1;
   }
   return 0;
}